

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O1

char * blogc_content_parse(char *src,size_t *end_excerpt,char **first_header,char **description,
                          char **endl,bc_slist_t **headers)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  _Bool _Var6;
  size_t sVar7;
  char *pcVar8;
  byte *__ptr;
  bc_string_t *str;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  bc_slist_t *pbVar12;
  bc_string_t *pbVar13;
  char *pcVar14;
  bc_slist_t *l_1;
  _bc_slist_t *p_Var15;
  undefined4 uVar16;
  bc_slist_t *l;
  char *format;
  char *pcVar17;
  char cVar18;
  uint uVar19;
  ulong uVar20;
  bc_slist_t *l_2;
  bool bVar21;
  ulong local_e8;
  char *local_e0;
  bc_slist_t *local_d0;
  ulong local_c0;
  bc_slist_t *local_b0;
  ulong local_a0;
  uint local_94;
  ulong local_88;
  size_t local_78;
  char *local_70;
  size_t local_58;
  
  sVar7 = strlen(src);
  if (endl == (char **)0x0) {
    __ptr = (byte *)bc_malloc(3);
    bVar5 = false;
  }
  else {
    pcVar14 = *endl;
    if (pcVar14 == (char *)0x0) {
      pcVar8 = (char *)bc_malloc(3);
      *endl = pcVar8;
    }
    bVar5 = pcVar14 != (char *)0x0;
    __ptr = (byte *)*endl;
  }
  if (!bVar5) {
    __ptr[0] = 10;
    __ptr[1] = 0;
  }
  str = bc_string_new();
  if (sVar7 != 0) {
    uVar16 = 1;
    uVar20 = 0;
    local_e8 = 0;
    local_b0 = (bc_slist_t *)0x0;
    local_d0 = (bc_slist_t *)0x0;
    local_94 = 0;
    local_58 = 0;
    local_e0 = (char *)0x0;
    local_70 = (char *)0x0;
    local_88 = 0;
    local_78 = 0;
    local_a0 = 0;
    local_c0 = 0;
    do {
      bVar2 = src[uVar20];
      uVar19 = (uint)bVar2;
      bVar21 = uVar20 == sVar7 - 1;
      if ((bVar2 == 0xd) || (bVar2 == 10)) {
        uVar1 = uVar20 + 1;
        uVar3 = uVar20;
        if (uVar1 < sVar7) {
          if (bVar2 == 0xd) {
            if (src[uVar1] == '\n') {
LAB_0010705d:
              if (!bVar5) {
                *__ptr = bVar2;
                __ptr[1] = src[uVar1];
                __ptr[2] = 0;
                bVar5 = true;
              }
              uVar19 = (uint)(byte)src[uVar1];
              bVar21 = uVar1 == sVar7 - 1;
              uVar3 = uVar1;
              local_88 = uVar20;
            }
          }
          else if ((bVar2 == 10) && (src[uVar1] == '\r')) goto LAB_0010705d;
        }
        uVar20 = uVar3;
        if (!bVar5) {
          *__ptr = (byte)uVar19;
          __ptr[1] = 0;
          bVar5 = true;
        }
      }
      cVar18 = (char)uVar19;
      uVar1 = local_c0;
      uVar4 = local_94;
      switch(uVar16) {
      case 1:
        uVar16 = 1;
        if (((cVar18 != '\n') && (uVar19 != 0xd)) && (!bVar21)) {
          if ((end_excerpt == (size_t *)0x0) || (cVar18 != '.')) {
            if (uVar19 - 0x2a < 2) {
LAB_001082e6:
              uVar16 = 0xf;
              local_e8 = uVar20;
              uVar1 = uVar20;
              uVar4 = uVar19;
            }
            else if (uVar19 == 0x23) {
              uVar16 = 4;
              local_70 = (char *)0x1;
              local_e8 = uVar20;
            }
            else {
              if (uVar19 == 0x2d) goto LAB_001082e6;
              uVar16 = 0x14;
              local_e8 = uVar20;
              uVar1 = uVar20;
              if (9 < (byte)(cVar18 - 0x30U)) {
                if (uVar19 < 0x3c) {
                  uVar16 = 0xc;
                  if ((uVar19 != 9) && (uVar19 != 0x20)) {
LAB_00108356:
                    uVar16 = 0x18;
                    uVar1 = local_c0;
                  }
                }
                else if (uVar19 == 0x3e) {
                  uVar16 = 9;
                }
                else {
                  if (uVar19 != 0x3c) goto LAB_00108356;
                  uVar16 = 7;
                  uVar1 = local_c0;
                }
              }
            }
          }
          else {
            local_78 = str->len;
            uVar16 = 2;
            local_e8 = uVar20;
          }
        }
        break;
      case 2:
        if (end_excerpt == (size_t *)0x0) {
LAB_001074c4:
          uVar16 = 0x18;
LAB_001074c9:
          local_78 = 0;
        }
        else if ((cVar18 == '\n') || (uVar19 == 0xd)) {
          uVar16 = 3;
        }
        else {
          uVar16 = 2;
          if (uVar19 != 0x2e) goto LAB_001074c4;
        }
        break;
      case 3:
        uVar16 = 0x19;
        if ((end_excerpt == (size_t *)0x0) || ((cVar18 != '\r' && (uVar19 != 10))))
        goto LAB_001074c9;
        *end_excerpt = local_78;
        uVar16 = 1;
        break;
      case 4:
        uVar16 = 5;
        if ((cVar18 != '\t') && (uVar19 != 0x20)) {
          if (uVar19 == 0x23) {
            local_70 = local_70 + 1;
            uVar16 = 4;
          }
          else {
            uVar16 = 0x18;
          }
        }
        break;
      case 5:
        if (0xc < uVar19) {
          if (uVar19 == 0x20) goto LAB_00107d6d;
          local_e8 = uVar20;
          if (uVar19 != 0xd) goto LAB_001074fe;
          goto switchD_001070bb_caseD_6;
        }
        if (uVar19 == 9) {
LAB_00107d6d:
          uVar16 = 5;
        }
        else {
          local_e8 = uVar20;
          if (uVar19 == 10) goto switchD_001070bb_caseD_6;
LAB_001074fe:
          uVar16 = 6;
          local_e8 = uVar20;
        }
        break;
      case 6:
switchD_001070bb_caseD_6:
        if (((cVar18 == '\n') || (uVar19 == 0xd)) || (bVar21)) {
          if ((((!bVar21) || (cVar18 == '\r')) || (local_a0 = sVar7, uVar19 == 10)) &&
             (local_a0 = local_88, local_88 == 0)) {
            local_a0 = uVar20;
          }
          pcVar14 = bc_strndup(src + local_e8,local_a0 - local_e8);
          if ((first_header != (char **)0x0) && (*first_header == (char *)0x0)) {
            pcVar8 = blogc_htmlentities(pcVar14);
            *first_header = pcVar8;
          }
          sVar9 = strlen(pcVar14);
          pcVar8 = blogc_content_parse_inline_internal(pcVar14,sVar9);
          pcVar10 = blogc_slugify(pcVar14);
          if (headers != (bc_slist_t **)0x0) {
            pbVar12 = blogc_toctree_append(*headers,(size_t)local_70,pcVar10,pcVar8);
            *headers = pbVar12;
          }
          if (pcVar10 == (char *)0x0) {
            format = "<h%d>%s</h%d>%s";
            pcVar11 = pcVar8;
            pcVar17 = local_70;
          }
          else {
            format = "<h%d id=\"%s\">%s</h%d>%s";
            pcVar11 = pcVar10;
            pcVar17 = pcVar8;
          }
          bc_string_append_printf(str,format,local_70,pcVar11,pcVar17);
          free(pcVar10);
          free(pcVar8);
          free(pcVar14);
LAB_00107c9b:
          uVar16 = 1;
          local_e8 = uVar20;
        }
        break;
      case 7:
        if ((((cVar18 == '\n') || (uVar19 == 0xd)) || (uVar16 = 7, bVar21)) &&
           (((!bVar21 || (cVar18 == '\r')) || (uVar16 = 8, local_a0 = sVar7, uVar19 == 10)))) {
          local_a0 = local_88;
          if (local_88 == 0) {
            local_a0 = uVar20;
          }
          uVar16 = 8;
        }
        if (bVar21) goto switchD_001070bb_caseD_8;
        break;
      case 8:
switchD_001070bb_caseD_8:
        if (((cVar18 == '\n') || (uVar19 == 0xd)) || (uVar16 = 7, bVar21)) {
          pcVar14 = bc_strndup(src + local_e8,local_a0 - local_e8);
          bc_string_append_printf(str,"%s%s",pcVar14,__ptr);
          free(pcVar14);
LAB_00107473:
          uVar16 = 1;
          local_e8 = uVar20;
          uVar4 = local_94;
        }
        break;
      case 9:
        uVar16 = 9;
        if ((cVar18 != '\t') && (uVar19 != 0x20)) {
          local_e0 = bc_strndup(src + local_e8,uVar20 - local_e8);
          uVar16 = 10;
        }
        break;
      case 10:
        if (((cVar18 == '\n') || (uVar19 == 0xd)) || (uVar16 = 10, bVar21)) {
          if ((((!bVar21) || (cVar18 == '\r')) || (local_a0 = sVar7, uVar19 == 10)) &&
             (local_a0 = local_88, local_88 == 0)) {
            local_a0 = uVar20;
          }
          pcVar14 = bc_strndup(src + local_c0,local_a0 - local_c0);
          _Var6 = bc_str_starts_with(pcVar14,local_e0);
          if (_Var6) {
            sVar9 = strlen(local_e0);
            pcVar8 = bc_strdup(pcVar14 + sVar9);
            local_d0 = bc_slist_append(local_d0,pcVar8);
            uVar16 = 0xb;
          }
          else {
            free(local_e0);
            bc_slist_free_full(local_d0,free);
            if (bVar21) {
              free(pcVar14);
              uVar16 = 0x18;
              local_e0 = (char *)0x0;
              local_d0 = (bc_slist_t *)0x0;
              goto LAB_001082c3;
            }
            uVar16 = 0x18;
            local_e0 = (char *)0x0;
            local_d0 = (bc_slist_t *)0x0;
          }
          free(pcVar14);
        }
        if (bVar21) goto switchD_001070bb_caseD_b;
        break;
      case 0xb:
switchD_001070bb_caseD_b:
        if (((cVar18 == '\n') || (uVar19 == 0xd)) || (uVar16 = 10, uVar1 = uVar20, bVar21)) {
          pbVar13 = bc_string_new();
          for (p_Var15 = local_d0; p_Var15 != (bc_slist_t *)0x0; p_Var15 = p_Var15->next) {
            bc_string_append_printf(pbVar13,"%s%s",p_Var15->data);
          }
          pcVar14 = blogc_content_parse(pbVar13->str,(size_t *)0x0,(char **)0x0,(char **)0x0,endl,
                                        (bc_slist_t **)0x0);
          bc_string_append_printf(str,"<blockquote>%s</blockquote>%s",pcVar14,__ptr);
          free(pcVar14);
          bc_string_free(pbVar13,true);
          bc_slist_free_full(local_d0,free);
          free(local_e0);
LAB_0010829d:
          uVar16 = 1;
          local_e0 = (char *)0x0;
          local_d0 = (bc_slist_t *)0x0;
          uVar1 = uVar20;
        }
        break;
      case 0xc:
        uVar16 = 0xc;
        if ((cVar18 != '\t') && (uVar19 != 0x20)) {
          local_e0 = bc_strndup(src + local_e8,uVar20 - local_e8);
          uVar16 = 0xd;
        }
        break;
      case 0xd:
        if (((cVar18 == '\n') || (uVar19 == 0xd)) || (uVar16 = 0xd, bVar21)) {
          if ((((!bVar21) || (cVar18 == '\r')) || (local_a0 = sVar7, uVar19 == 10)) &&
             (local_a0 = local_88, local_88 == 0)) {
            local_a0 = uVar20;
          }
          pcVar14 = bc_strndup(src + local_c0,local_a0 - local_c0);
          _Var6 = bc_str_starts_with(pcVar14,local_e0);
          if (!_Var6) {
            free(local_e0);
            bc_slist_free_full(local_d0,free);
            free(pcVar14);
            uVar16 = 0x18;
LAB_00107e49:
            local_e0 = (char *)0x0;
            local_d0 = (bc_slist_t *)0x0;
            if (bVar21) {
              local_d0 = (bc_slist_t *)0x0;
              goto LAB_001082c3;
            }
            break;
          }
          sVar9 = strlen(local_e0);
          pcVar8 = bc_strdup(pcVar14 + sVar9);
          local_d0 = bc_slist_append(local_d0,pcVar8);
          free(pcVar14);
          uVar16 = 0xe;
        }
        if (bVar21) goto switchD_001070bb_caseD_e;
        break;
      case 0xe:
switchD_001070bb_caseD_e:
        if (((cVar18 == '\n') || (uVar19 == 0xd)) || (uVar16 = 0xd, uVar1 = uVar20, bVar21)) {
          bc_string_append(str,"<pre><code>");
          for (p_Var15 = local_d0; p_Var15 != (bc_slist_t *)0x0; p_Var15 = p_Var15->next) {
            pcVar14 = blogc_htmlentities((char *)p_Var15->data);
            if (p_Var15->next == (_bc_slist_t *)0x0) {
              bc_string_append_printf(str,"%s",pcVar14);
            }
            else {
              bc_string_append_printf(str,"%s%s",pcVar14,__ptr);
            }
            free(pcVar14);
          }
          bc_string_append_printf(str,"</code></pre>%s",__ptr);
LAB_00108289:
          bc_slist_free_full(local_d0,free);
          free(local_e0);
          goto LAB_0010829d;
        }
        break;
      case 0xf:
        if (uVar20 == local_e8 + 1) {
          uVar16 = 0x10;
          if (cVar18 != (char)local_94) {
            if ((char)local_94 != '*') goto LAB_00107ac8;
            if ((cVar18 == '\t') || (uVar16 = 0x18, uVar19 == 0x20)) {
              uVar16 = 0xf;
            }
          }
        }
        else {
LAB_00107ac8:
          uVar16 = 0xf;
          if ((cVar18 != '\t') && (uVar19 != 0x20)) {
            local_e0 = bc_strndup(src + local_e8,uVar20 - local_e8);
            uVar16 = 0x12;
          }
        }
        break;
      case 0x10:
        uVar16 = 0x18;
        if (cVar18 != (char)local_94) break;
        uVar16 = 0x11;
LAB_00107ab9:
        if (!bVar21) break;
        goto LAB_001082c3;
      case 0x11:
        if (((cVar18 != (char)local_94) || (uVar16 = 0x11, bVar21)) &&
           ((cVar18 == '\n' || ((uVar19 == 0xd || (uVar16 = 0x18, bVar21)))))) {
          local_94 = 0;
          bc_string_append_printf(str,"<hr />%s",__ptr);
          goto LAB_00107473;
        }
        break;
      case 0x12:
        if (((cVar18 == '\n') || (uVar19 == 0xd)) || (uVar16 = 0x12, bVar21)) {
          if ((((!bVar21) || (cVar18 == '\r')) || (local_a0 = sVar7, uVar19 == 10)) &&
             (local_a0 = local_88, local_88 == 0)) {
            local_a0 = uVar20;
          }
          pcVar14 = bc_strndup(src + local_c0,local_a0 - local_c0);
          sVar9 = strlen(local_e0);
          pcVar8 = bc_strdup_printf("%-*s",sVar9,"");
          _Var6 = bc_str_starts_with(pcVar14,local_e0);
          if (_Var6) {
            if (local_b0 == (bc_slist_t *)0x0) {
              local_b0 = (bc_slist_t *)0x0;
            }
            else {
              pbVar13 = bc_string_new();
              p_Var15 = local_b0;
              do {
                if (p_Var15->next == (_bc_slist_t *)0x0) {
                  bc_string_append_printf(pbVar13,"%s",p_Var15->data);
                }
                else {
                  bc_string_append_printf(pbVar13,"%s%s",p_Var15->data,__ptr);
                }
                p_Var15 = p_Var15->next;
              } while (p_Var15 != (_bc_slist_t *)0x0);
              bc_slist_free_full(local_b0,free);
              pcVar10 = pbVar13->str;
              sVar9 = strlen(pcVar10);
              pcVar10 = blogc_content_parse_inline_internal(pcVar10,sVar9);
              bc_string_free(pbVar13,true);
              pcVar11 = bc_strdup(pcVar10);
              local_d0 = bc_slist_append(local_d0,pcVar11);
              free(pcVar10);
              local_b0 = (bc_slist_t *)0x0;
            }
          }
          else {
            _Var6 = bc_str_starts_with(pcVar14,pcVar8);
            if (!_Var6) {
              free(pcVar14);
              free(pcVar8);
              free(local_e0);
              bc_slist_free_full(local_d0,free);
              bc_slist_free_full(local_b0,free);
              uVar16 = 0x19;
              goto LAB_00107e49;
            }
          }
          sVar9 = strlen(local_e0);
          pcVar10 = bc_strdup(pcVar14 + sVar9);
          local_b0 = bc_slist_append(local_b0,pcVar10);
          free(pcVar14);
          free(pcVar8);
          uVar16 = 0x13;
        }
        if (bVar21) goto switchD_001070bb_caseD_13;
        break;
      case 0x13:
switchD_001070bb_caseD_13:
        if (((cVar18 == '\n') || (uVar19 == 0xd)) || (uVar16 = 0x12, uVar1 = uVar20, bVar21)) {
          if (local_b0 != (bc_slist_t *)0x0) {
            pbVar13 = bc_string_new();
            p_Var15 = local_b0;
            do {
              if (p_Var15->next == (_bc_slist_t *)0x0) {
                bc_string_append_printf(pbVar13,"%s",p_Var15->data);
              }
              else {
                bc_string_append_printf(pbVar13,"%s%s",p_Var15->data,__ptr);
              }
              p_Var15 = p_Var15->next;
            } while (p_Var15 != (_bc_slist_t *)0x0);
            bc_slist_free_full(local_b0,free);
            pcVar14 = pbVar13->str;
            sVar9 = strlen(pcVar14);
            pcVar14 = blogc_content_parse_inline_internal(pcVar14,sVar9);
            bc_string_free(pbVar13,true);
            pcVar8 = bc_strdup(pcVar14);
            local_d0 = bc_slist_append(local_d0,pcVar8);
            free(pcVar14);
          }
          bc_string_append_printf(str,"<ul>%s",__ptr);
          for (p_Var15 = local_d0; p_Var15 != (bc_slist_t *)0x0; p_Var15 = p_Var15->next) {
            bc_string_append_printf(str,"<li>%s</li>%s",p_Var15->data,__ptr);
          }
          pcVar14 = "</ul>%s";
LAB_00108269:
          local_b0 = (bc_slist_t *)0x0;
          bc_string_append_printf(str,pcVar14,__ptr);
          goto LAB_00108289;
        }
        break;
      case 0x14:
        uVar16 = 0x14;
        if ((9 < (byte)(cVar18 - 0x30U)) && (uVar16 = 0x15, cVar18 != '.')) {
          uVar16 = 0x18;
          goto LAB_00107ab9;
        }
        break;
      case 0x15:
        uVar16 = 0x15;
        if (((cVar18 != '\t') && (uVar19 != 0x20)) &&
           ((local_58 = uVar20 - local_e8, cVar18 == '\n' ||
            ((uVar19 == 0xd || (uVar16 = 0x16, bVar21)))))) goto switchD_001070bb_caseD_16;
        break;
      case 0x16:
switchD_001070bb_caseD_16:
        if ((cVar18 == '\n') || ((uVar19 == 0xd || (uVar16 = 0x16, bVar21)))) {
          if (((!bVar21) || ((cVar18 == '\r' || (local_a0 = sVar7, uVar19 == 10)))) &&
             (local_a0 = local_88, local_88 == 0)) {
            local_a0 = uVar20;
          }
          pcVar14 = bc_strndup(src + local_c0,local_a0 - local_c0);
          pcVar8 = bc_strdup_printf("%-*s",local_58,"");
          _Var6 = blogc_is_ordered_list_item(pcVar14,local_58);
          if (_Var6) {
            if (local_b0 == (bc_slist_t *)0x0) {
              local_b0 = (bc_slist_t *)0x0;
            }
            else {
              pbVar13 = bc_string_new();
              p_Var15 = local_b0;
              do {
                if (p_Var15->next == (_bc_slist_t *)0x0) {
                  bc_string_append_printf(pbVar13,"%s",p_Var15->data);
                }
                else {
                  bc_string_append_printf(pbVar13,"%s%s",p_Var15->data,__ptr);
                }
                p_Var15 = p_Var15->next;
              } while (p_Var15 != (_bc_slist_t *)0x0);
              bc_slist_free_full(local_b0,free);
              pcVar10 = pbVar13->str;
              sVar9 = strlen(pcVar10);
              pcVar10 = blogc_content_parse_inline_internal(pcVar10,sVar9);
              bc_string_free(pbVar13,true);
              pcVar11 = bc_strdup(pcVar10);
              local_d0 = bc_slist_append(local_d0,pcVar11);
              free(pcVar10);
              local_b0 = (bc_slist_t *)0x0;
            }
          }
          else {
            _Var6 = bc_str_starts_with(pcVar14,pcVar8);
            if (!_Var6) {
              free(pcVar14);
              free(pcVar8);
              bc_slist_free_full(local_d0,free);
              bc_slist_free_full(local_b0,free);
              uVar16 = 0x19;
              local_d0 = (bc_slist_t *)0x0;
              if (bVar21) goto LAB_001082c3;
              break;
            }
          }
          pcVar10 = bc_strdup(pcVar14 + local_58);
          local_b0 = bc_slist_append(local_b0,pcVar10);
          free(pcVar14);
          free(pcVar8);
          uVar16 = 0x17;
        }
        if (bVar21) goto switchD_001070bb_caseD_17;
        break;
      case 0x17:
switchD_001070bb_caseD_17:
        if (((cVar18 == '\n') || (uVar19 == 0xd)) || (uVar16 = 0x16, uVar1 = uVar20, bVar21)) {
          if (local_b0 != (bc_slist_t *)0x0) {
            pbVar13 = bc_string_new();
            p_Var15 = local_b0;
            do {
              if (p_Var15->next == (_bc_slist_t *)0x0) {
                bc_string_append_printf(pbVar13,"%s",p_Var15->data);
              }
              else {
                bc_string_append_printf(pbVar13,"%s%s",p_Var15->data,__ptr);
              }
              p_Var15 = p_Var15->next;
            } while (p_Var15 != (_bc_slist_t *)0x0);
            bc_slist_free_full(local_b0,free);
            pcVar14 = pbVar13->str;
            sVar9 = strlen(pcVar14);
            pcVar14 = blogc_content_parse_inline_internal(pcVar14,sVar9);
            bc_string_free(pbVar13,true);
            pcVar8 = bc_strdup(pcVar14);
            local_d0 = bc_slist_append(local_d0,pcVar8);
            free(pcVar14);
          }
          bc_string_append_printf(str,"<ol>%s",__ptr);
          for (p_Var15 = local_d0; p_Var15 != (bc_slist_t *)0x0; p_Var15 = p_Var15->next) {
            bc_string_append_printf(str,"<li>%s</li>%s",p_Var15->data,__ptr);
          }
          pcVar14 = "</ol>%s";
          goto LAB_00108269;
        }
        break;
      case 0x18:
        if ((((cVar18 == '\n') || (uVar19 == 0xd)) || (uVar16 = 0x18, bVar21)) &&
           (((!bVar21 || (cVar18 == '\r')) || (uVar16 = 0x19, local_a0 = sVar7, uVar19 == 10)))) {
          local_a0 = local_88;
          if (local_88 == 0) {
            local_a0 = uVar20;
          }
          uVar16 = 0x19;
        }
        if (bVar21) goto switchD_001070bb_caseD_19;
        break;
      case 0x19:
switchD_001070bb_caseD_19:
        if (((cVar18 == '\n') || (uVar19 == 0xd)) || (uVar16 = 0x18, bVar21)) {
          pcVar14 = bc_strndup(src + local_e8,local_a0 - local_e8);
          if ((description != (char **)0x0) && (*description == (char *)0x0)) {
            pcVar8 = blogc_fix_description(pcVar14);
            *description = pcVar8;
          }
          sVar9 = strlen(pcVar14);
          pcVar8 = blogc_content_parse_inline_internal(pcVar14,sVar9);
          bc_string_append_printf(str,"<p>%s</p>%s",pcVar8,__ptr);
          free(pcVar8);
          free(pcVar14);
          goto LAB_00107c9b;
        }
      }
      local_94 = uVar4;
      local_c0 = uVar1;
      uVar20 = uVar20 + 1;
LAB_001082c3:
    } while (uVar20 < sVar7);
  }
  if (endl == (char **)0x0) {
    free(__ptr);
  }
  pcVar14 = bc_string_free(str,false);
  return pcVar14;
}

Assistant:

char*
blogc_content_parse(const char *src, size_t *end_excerpt, char **first_header,
    char **description, char **endl, bc_slist_t **headers)
{
    // src is always nul-terminated.
    size_t src_len = strlen(src);

    size_t current = 0;
    size_t start = 0;
    size_t start2 = 0;
    size_t end = 0;
    size_t eend = 0;
    size_t real_end = 0;

    size_t header_level = 0;
    char *prefix = NULL;
    size_t prefix_len = 0;
    char *tmp = NULL;
    char *tmp2 = NULL;
    char *parsed = NULL;
    char *slug = NULL;

    char *line_ending = NULL;
    bool line_ending_found = false;
    if (endl != NULL) {
        if (*endl != NULL) {
            line_ending_found = true;
        }
        else {
            *endl = bc_malloc(3 * sizeof(char));
        }
        line_ending = *endl;
    }
    else {
        line_ending = bc_malloc(3 * sizeof(char));
    }

    // this isn't empty because we need some reasonable default value in the
    // unlikely case that we need to print some line ending before evaluating
    // the "real" value.
    if (!line_ending_found) {
        line_ending[0] = '\n';
        line_ending[1] = '\0';
    }

    char d = '\0';

    bc_slist_t *lines = NULL;
    bc_slist_t *lines2 = NULL;

    bc_string_t *rv = bc_string_new();
    bc_string_t *tmp_str = NULL;

    blogc_content_parser_state_t state = CONTENT_START_LINE;

    while (current < src_len) {
        char c = src[current];
        bool is_last = current == src_len - 1;

        if (c == '\n' || c == '\r') {
            if ((current + 1) < src_len) {
                if ((c == '\n' && src[current + 1] == '\r') ||
                    (c == '\r' && src[current + 1] == '\n'))
                {
                    if (!line_ending_found) {
                        line_ending[0] = c;
                        line_ending[1] = src[current + 1];
                        line_ending[2] = '\0';
                        line_ending_found = true;
                    }
                    real_end = current;
                    c = src[++current];
                    is_last = current == src_len - 1;
                }
            }
            if (!line_ending_found) {
                line_ending[0] = c;
                line_ending[1] = '\0';
                line_ending_found = true;
            }
        }

        switch (state) {

            case CONTENT_START_LINE:
                if (c == '\n' || c == '\r' || is_last)
                    break;
                start = current;
                if (c == '.') {
                    if (end_excerpt != NULL) {
                        eend = rv->len;  // fuck it
                        state = CONTENT_EXCERPT;
                        break;
                    }
                }
                if (c == '#') {
                    header_level = 1;
                    state = CONTENT_HEADER;
                    break;
                }
                if (c == '*' || c == '+' || c == '-') {
                    start2 = current;
                    state = CONTENT_UNORDERED_LIST_OR_HORIZONTAL_RULE_OR_EMPHASIS;
                    d = c;
                    break;
                }
                if (c >= '0' && c <= '9') {
                    start2 = current;
                    state = CONTENT_ORDERED_LIST;
                    break;
                }
                if (c == ' ' || c == '\t') {
                    start2 = current;
                    state = CONTENT_CODE;
                    break;
                }
                if (c == '<') {
                    state = CONTENT_HTML;
                    break;
                }
                if (c == '>') {
                    state = CONTENT_BLOCKQUOTE;
                    start2 = current;
                    break;
                }
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_EXCERPT:
                if (end_excerpt != NULL) {
                    if (c == '.')
                        break;
                    if (c == '\n' || c == '\r') {
                        state = CONTENT_EXCERPT_END;
                        break;
                    }
                }
                eend = 0;
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_EXCERPT_END:
                if (end_excerpt != NULL) {
                    if (c == '\n' || c == '\r') {
                        *end_excerpt = eend;
                        state = CONTENT_START_LINE;
                        break;
                    }
                }
                eend = 0;
                state = CONTENT_PARAGRAPH_END;
                break;

            case CONTENT_HEADER:
                if (c == '#') {
                    header_level += 1;
                    break;
                }
                if (c == ' ' || c == '\t') {
                    state = CONTENT_HEADER_TITLE_START;
                    break;
                }
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_HEADER_TITLE_START:
                if (c == ' ' || c == '\t')
                    break;
                start = current;
                if (c != '\n' && c != '\r') {
                    state = CONTENT_HEADER_TITLE;
                    break;
                }

            case CONTENT_HEADER_TITLE:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start, end - start);
                    if (first_header != NULL && *first_header == NULL)
                        *first_header = blogc_htmlentities(tmp);
                    parsed = blogc_content_parse_inline(tmp);
                    slug = blogc_slugify(tmp);
                    if (headers != NULL)
                        *headers = blogc_toctree_append(*headers, header_level, slug, parsed);
                    if (slug == NULL)
                        bc_string_append_printf(rv, "<h%d>%s</h%d>%s",
                            header_level, parsed, header_level, line_ending);
                    else
                        bc_string_append_printf(rv, "<h%d id=\"%s\">%s</h%d>%s",
                            header_level, slug, parsed, header_level,
                            line_ending);
                    free(slug);
                    free(parsed);
                    parsed = NULL;
                    free(tmp);
                    tmp = NULL;
                    state = CONTENT_START_LINE;
                    start = current;
                }
                break;

            case CONTENT_HTML:
                if (c == '\n' || c == '\r' || is_last) {
                    state = CONTENT_HTML_END;
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                }
                if (!is_last)
                    break;

            case CONTENT_HTML_END:
                if (c == '\n' || c == '\r' || is_last) {
                    tmp = bc_strndup(src + start, end - start);
                    bc_string_append_printf(rv, "%s%s", tmp, line_ending);
                    free(tmp);
                    tmp = NULL;
                    state = CONTENT_START_LINE;
                    start = current;
                }
                else
                    state = CONTENT_HTML;
                break;

            case CONTENT_BLOCKQUOTE:
                if (c == ' ' || c == '\t')
                    break;
                prefix = bc_strndup(src + start, current - start);
                state = CONTENT_BLOCKQUOTE_START;
                break;

            case CONTENT_BLOCKQUOTE_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    if (bc_str_starts_with(tmp, prefix)) {
                        lines = bc_slist_append(lines, bc_strdup(tmp + strlen(prefix)));
                        state = CONTENT_BLOCKQUOTE_END;
                    }
                    else {
                        state = CONTENT_PARAGRAPH;
                        free(prefix);
                        prefix = NULL;
                        bc_slist_free_full(lines, free);
                        lines = NULL;
                        if (is_last) {
                            free(tmp);
                            tmp = NULL;
                            continue;
                        }
                    }
                    free(tmp);
                    tmp = NULL;
                }
                if (!is_last)
                    break;

            case CONTENT_BLOCKQUOTE_END:
                if (c == '\n' || c == '\r' || is_last) {
                    tmp_str = bc_string_new();
                    for (bc_slist_t *l = lines; l != NULL; l = l->next)
                        bc_string_append_printf(tmp_str, "%s%s", l->data,
                            line_ending);
                    // do not propagate title and description to blockquote parsing,
                    // because we just want paragraphs from first level of
                    // content.
                    tmp = blogc_content_parse(tmp_str->str, NULL, NULL, NULL, endl, NULL);
                    bc_string_append_printf(rv, "<blockquote>%s</blockquote>%s",
                        tmp, line_ending);
                    free(tmp);
                    tmp = NULL;
                    bc_string_free(tmp_str, true);
                    tmp_str = NULL;
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_BLOCKQUOTE_START;
                }
                break;

            case CONTENT_CODE:
                if (c == ' ' || c == '\t')
                    break;
                prefix = bc_strndup(src + start, current - start);
                state = CONTENT_CODE_START;
                break;

            case CONTENT_CODE_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    if (bc_str_starts_with(tmp, prefix)) {
                        lines = bc_slist_append(lines, bc_strdup(tmp + strlen(prefix)));
                        state = CONTENT_CODE_END;
                    }
                    else {
                        state = CONTENT_PARAGRAPH;
                        free(prefix);
                        prefix = NULL;
                        bc_slist_free_full(lines, free);
                        lines = NULL;
                        free(tmp);
                        tmp = NULL;
                        if (is_last)
                            continue;
                        break;
                    }
                    free(tmp);
                    tmp = NULL;
                }
                if (!is_last)
                    break;

            case CONTENT_CODE_END:
                if (c == '\n' || c == '\r' || is_last) {
                    bc_string_append(rv, "<pre><code>");
                    for (bc_slist_t *l = lines; l != NULL; l = l->next) {
                        char *tmp_line = blogc_htmlentities(l->data);
                        if (l->next == NULL)
                            bc_string_append_printf(rv, "%s", tmp_line);
                        else
                            bc_string_append_printf(rv, "%s%s", tmp_line,
                                line_ending);
                        free(tmp_line);
                    }
                    bc_string_append_printf(rv, "</code></pre>%s", line_ending);
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_CODE_START;
                }
                break;

            case CONTENT_UNORDERED_LIST_OR_HORIZONTAL_RULE_OR_EMPHASIS:
                if (current == start+1) {
                    if (c == d) { // horizontal rule or '**' emphasis
                        state = CONTENT_HORIZONTAL_RULE_OR_EMPHASIS;
                        break;
                    }
                    else if (c != ' ' && c != '\t' && d == '*') { // is '*' emphasis
                        state = CONTENT_PARAGRAPH;
                        break;
                    }
                }
                if (c == ' ' || c == '\t')
                    break;
                prefix = bc_strndup(src + start, current - start);
                state = CONTENT_UNORDERED_LIST_START;
                break;

            case CONTENT_HORIZONTAL_RULE_OR_EMPHASIS:
                // 3rd '-' or '*' required for a horizontal rule
                if (c == d) {
                    state = CONTENT_HORIZONTAL_RULE;
                    if (is_last)
                        continue;
                    break;
                }
                // is '**' emphasis
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_HORIZONTAL_RULE:
                if (c == d && !is_last) {
                    break;
                }
                if (c == '\n' || c == '\r' || is_last) {
                    bc_string_append_printf(rv, "<hr />%s", line_ending);
                    state = CONTENT_START_LINE;
                    start = current;
                    d = '\0';
                    break;
                }
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_UNORDERED_LIST_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    tmp2 = bc_strdup_printf("%-*s", strlen(prefix), "");
                    if (bc_str_starts_with(tmp, prefix)) {
                        if (lines2 != NULL) {
                            tmp_str = bc_string_new();
                            for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                                if (l->next == NULL)
                                    bc_string_append_printf(tmp_str, "%s", l->data);
                                else
                                    bc_string_append_printf(tmp_str, "%s%s", l->data,
                                        line_ending);
                            }
                            bc_slist_free_full(lines2, free);
                            lines2 = NULL;
                            parsed = blogc_content_parse_inline(tmp_str->str);
                            bc_string_free(tmp_str, true);
                            lines = bc_slist_append(lines, bc_strdup(parsed));
                            free(parsed);
                            parsed = NULL;
                        }
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + strlen(prefix)));
                    }
                    else if (bc_str_starts_with(tmp, tmp2)) {
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + strlen(prefix)));
                    }
                    else {
                        state = CONTENT_PARAGRAPH_END;
                        free(tmp);
                        tmp = NULL;
                        free(tmp2);
                        tmp2 = NULL;
                        free(prefix);
                        prefix = NULL;
                        bc_slist_free_full(lines, free);
                        bc_slist_free_full(lines2, free);
                        lines = NULL;
                        if (is_last)
                            continue;
                        break;
                    }
                    free(tmp);
                    tmp = NULL;
                    free(tmp2);
                    tmp2 = NULL;
                    state = CONTENT_UNORDERED_LIST_END;
                }
                if (!is_last)
                    break;

            case CONTENT_UNORDERED_LIST_END:
                if (c == '\n' || c == '\r' || is_last) {
                    if (lines2 != NULL) {
                        // FIXME: avoid repeting the code below
                        tmp_str = bc_string_new();
                        for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                            if (l->next == NULL)
                                bc_string_append_printf(tmp_str, "%s", l->data);
                            else
                                bc_string_append_printf(tmp_str, "%s%s", l->data,
                                    line_ending);
                        }
                        bc_slist_free_full(lines2, free);
                        lines2 = NULL;
                        parsed = blogc_content_parse_inline(tmp_str->str);
                        bc_string_free(tmp_str, true);
                        lines = bc_slist_append(lines, bc_strdup(parsed));
                        free(parsed);
                        parsed = NULL;
                    }
                    bc_string_append_printf(rv, "<ul>%s", line_ending);
                    for (bc_slist_t *l = lines; l != NULL; l = l->next)
                        bc_string_append_printf(rv, "<li>%s</li>%s", l->data,
                            line_ending);
                    bc_string_append_printf(rv, "</ul>%s", line_ending);
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_UNORDERED_LIST_START;
                }
                break;

            case CONTENT_ORDERED_LIST:
                if (c >= '0' && c <= '9')
                    break;
                if (c == '.') {
                    state = CONTENT_ORDERED_LIST_SPACE;
                    break;
                }
                state = CONTENT_PARAGRAPH;
                if (is_last)
                    continue;
                break;

            case CONTENT_ORDERED_LIST_SPACE:
                if (c == ' ' || c == '\t')
                    break;
                prefix_len = current - start;
                state = CONTENT_ORDERED_LIST_START;
                if (c != '\n' && c != '\r' && !is_last)
                    break;

            case CONTENT_ORDERED_LIST_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    tmp2 = bc_strdup_printf("%-*s", prefix_len, "");
                    if (blogc_is_ordered_list_item(tmp, prefix_len)) {
                        if (lines2 != NULL) {
                            tmp_str = bc_string_new();
                            for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                                if (l->next == NULL)
                                    bc_string_append_printf(tmp_str, "%s", l->data);
                                else
                                    bc_string_append_printf(tmp_str, "%s%s", l->data,
                                        line_ending);
                            }
                            bc_slist_free_full(lines2, free);
                            lines2 = NULL;
                            parsed = blogc_content_parse_inline(tmp_str->str);
                            bc_string_free(tmp_str, true);
                            lines = bc_slist_append(lines, bc_strdup(parsed));
                            free(parsed);
                            parsed = NULL;
                        }
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + prefix_len));
                    }
                    else if (bc_str_starts_with(tmp, tmp2)) {
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + prefix_len));
                    }
                    else {
                        state = CONTENT_PARAGRAPH_END;
                        free(tmp);
                        tmp = NULL;
                        free(tmp2);
                        tmp2 = NULL;
                        free(parsed);
                        parsed = NULL;
                        bc_slist_free_full(lines, free);
                        bc_slist_free_full(lines2, free);
                        lines = NULL;
                        if (is_last)
                            continue;
                        break;
                    }
                    free(tmp);
                    tmp = NULL;
                    free(tmp2);
                    tmp2 = NULL;
                    state = CONTENT_ORDERED_LIST_END;
                }
                if (!is_last)
                    break;

            case CONTENT_ORDERED_LIST_END:
                if (c == '\n' || c == '\r' || is_last) {
                    if (lines2 != NULL) {
                        // FIXME: avoid repeting the code below
                        tmp_str = bc_string_new();
                        for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                            if (l->next == NULL)
                                bc_string_append_printf(tmp_str, "%s", l->data);
                            else
                                bc_string_append_printf(tmp_str, "%s%s", l->data,
                                    line_ending);
                        }
                        bc_slist_free_full(lines2, free);
                        lines2 = NULL;
                        parsed = blogc_content_parse_inline(tmp_str->str);
                        bc_string_free(tmp_str, true);
                        lines = bc_slist_append(lines, bc_strdup(parsed));
                        free(parsed);
                        parsed = NULL;
                    }
                    bc_string_append_printf(rv, "<ol>%s", line_ending);
                    for (bc_slist_t *l = lines; l != NULL; l = l->next)
                        bc_string_append_printf(rv, "<li>%s</li>%s", l->data,
                            line_ending);
                    bc_string_append_printf(rv, "</ol>%s", line_ending);
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_ORDERED_LIST_START;
                }
                break;

            case CONTENT_PARAGRAPH:
                if (c == '\n' || c == '\r' || is_last) {
                    state = CONTENT_PARAGRAPH_END;
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                }
                if (!is_last)
                    break;

            case CONTENT_PARAGRAPH_END:
                if (c == '\n' || c == '\r' || is_last) {
                    tmp = bc_strndup(src + start, end - start);
                    if (description != NULL && *description == NULL)
                        *description = blogc_fix_description(tmp);
                    parsed = blogc_content_parse_inline(tmp);
                    bc_string_append_printf(rv, "<p>%s</p>%s", parsed,
                        line_ending);
                    free(parsed);
                    parsed = NULL;
                    free(tmp);
                    tmp = NULL;
                    state = CONTENT_START_LINE;
                    start = current;
                }
                else
                    state = CONTENT_PARAGRAPH;
                break;

        }

        current++;
    }

    if (endl == NULL) {
        free(line_ending);
    }

    return bc_string_free(rv, false);
}